

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int init_blocksize(vorb *f,int b,int n)

{
  float *pfVar1;
  short sVar2;
  short sVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  float *pfVar28;
  float *pfVar29;
  uint16 *puVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  double dVar38;
  int iVar40;
  undefined1 auVar39 [16];
  int iVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar64;
  undefined1 auVar59 [16];
  int iVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ushort uVar77;
  undefined1 auVar82 [12];
  undefined1 in_XMM15 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  long lVar47;
  undefined4 uVar78;
  undefined6 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [12];
  undefined1 auVar83 [14];
  undefined1 auVar84 [14];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  
  uVar34 = n * 2 & 0xfffffffc;
  pfVar28 = (float *)setup_malloc(f,uVar34);
  f->A[(uint)b] = pfVar28;
  pfVar28 = (float *)setup_malloc(f,uVar34);
  f->B[(uint)b] = pfVar28;
  pfVar29 = (float *)setup_malloc(f,n & 0xfffffffc);
  f->C[(uint)b] = pfVar29;
  pfVar28 = f->A[(uint)b];
  if ((pfVar28 != (float *)0x0) &&
     (pfVar1 = f->B[(uint)b], pfVar29 != (float *)0x0 && pfVar1 != (float *)0x0)) {
    uVar32 = n >> 2;
    uVar27 = n >> 3;
    fVar42 = (float)n;
    if (0 < (int)uVar32) {
      lVar35 = 1;
      iVar36 = 0;
      uVar33 = uVar32;
      do {
        dVar38 = (double)SDL_cos();
        pfVar28[lVar35 + -1] = (float)dVar38;
        dVar38 = (double)SDL_sin((double)(((float)iVar36 * 3.1415927) / fVar42));
        pfVar28[lVar35] = -(float)dVar38;
        dVar38 = (double)SDL_cos();
        pfVar1[lVar35 + -1] = (float)dVar38 * 0.5;
        dVar38 = (double)SDL_sin((double)((((float)(int)lVar35 * 3.1415927) / fVar42) * 0.5));
        pfVar1[lVar35] = (float)dVar38 * 0.5;
        lVar35 = lVar35 + 2;
        iVar36 = iVar36 + 4;
        uVar33 = uVar33 - 1;
      } while (uVar33 != 0);
    }
    if (0 < (int)uVar27) {
      lVar35 = 2;
      uVar37 = (ulong)uVar27;
      do {
        dVar38 = (double)SDL_cos();
        *(float *)((long)pfVar29 + lVar35 * 2 + -4) = (float)dVar38;
        dVar38 = (double)SDL_sin((double)(((float)(int)lVar35 * 3.1415927) / fVar42));
        *(float *)((long)pfVar29 + lVar35 * 2) = -(float)dVar38;
        lVar35 = lVar35 + 4;
        uVar33 = (int)uVar37 - 1;
        uVar37 = (ulong)uVar33;
      } while (uVar33 != 0);
    }
    pfVar28 = (float *)setup_malloc(f,uVar34);
    f->window[(uint)b] = pfVar28;
    if (pfVar28 != (float *)0x0) {
      uVar34 = n >> 1;
      if (0 < (int)uVar34) {
        uVar37 = 0;
        do {
          dVar38 = (double)SDL_sin((((double)(int)uVar37 + 0.5) / (double)(int)uVar34) * 0.5 *
                                   3.1415927410125732);
          dVar38 = (double)SDL_sin((double)((float)dVar38 * (float)dVar38) * 1.5707963705062866);
          pfVar28[uVar37] = (float)dVar38;
          uVar37 = uVar37 + 1;
        } while (uVar34 != uVar37);
      }
      puVar30 = (uint16 *)setup_malloc(f,uVar32 & 0xfffffffe);
      f->bit_reverse[(uint)b] = puVar30;
      if (puVar30 != (uint16 *)0x0) {
        if ((int)uVar27 < 1) {
          return 1;
        }
        iVar36 = ilog(n);
        auVar26 = _DAT_0012ad90;
        auVar25 = _DAT_00126030;
        bVar31 = 0x24 - (char)iVar36;
        lVar35 = (ulong)uVar27 - 1;
        auVar39._8_4_ = (int)lVar35;
        auVar39._0_8_ = lVar35;
        auVar39._12_4_ = (int)((ulong)lVar35 >> 0x20);
        lVar35 = 0;
        auVar39 = auVar39 ^ _DAT_00126030;
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar43 = _DAT_0012ad70;
        auVar44 = _DAT_0012ad80;
        auVar46 = _DAT_0012ad20;
        auVar48 = _DAT_0012ad30;
        auVar49 = _DAT_001266a0;
        auVar50 = _DAT_001266b0;
        do {
          auVar59 = auVar50 ^ auVar25;
          iVar36 = auVar39._0_4_;
          auVar66._0_4_ = -(uint)(iVar36 < auVar59._0_4_);
          iVar40 = auVar39._4_4_;
          auVar66._4_4_ = -(uint)(iVar40 < auVar59._4_4_);
          iVar70 = auVar39._8_4_;
          auVar66._8_4_ = -(uint)(iVar70 < auVar59._8_4_);
          iVar41 = auVar39._12_4_;
          auVar66._12_4_ = -(uint)(iVar41 < auVar59._12_4_);
          auVar76._4_4_ = auVar66._0_4_;
          auVar76._0_4_ = auVar66._0_4_;
          auVar76._8_4_ = auVar66._8_4_;
          auVar76._12_4_ = auVar66._8_4_;
          auVar85 = pshuflw(in_XMM15,auVar76,0xe8);
          iVar64 = -(uint)(auVar59._4_4_ == iVar40);
          iVar65 = -(uint)(auVar59._12_4_ == iVar41);
          auVar75._4_4_ = iVar64;
          auVar75._0_4_ = iVar64;
          auVar75._8_4_ = iVar65;
          auVar75._12_4_ = iVar65;
          auVar71 = pshuflw(in_XMM11,auVar75,0xe8);
          auVar59._4_4_ = auVar66._4_4_;
          auVar59._0_4_ = auVar66._4_4_;
          auVar59._8_4_ = auVar66._12_4_;
          auVar59._12_4_ = auVar66._12_4_;
          auVar66 = pshuflw(auVar66,auVar59,0xe8);
          auVar67 = (auVar66 | auVar71 & auVar85) ^ auVar67;
          auVar67 = packssdw(auVar67,auVar67);
          auVar71[1] = 0;
          auVar71[0] = auVar44[8];
          auVar71[2] = auVar44[9];
          auVar71[3] = 0;
          auVar71[4] = auVar44[10];
          auVar71[5] = 0;
          auVar71[6] = auVar44[0xb];
          auVar71[7] = 0;
          auVar71[8] = auVar44[0xc];
          auVar71[9] = 0;
          auVar71[10] = auVar44[0xd];
          auVar71[0xb] = 0;
          auVar71[0xc] = auVar44[0xe];
          auVar71[0xd] = 0;
          auVar71[0xe] = auVar44[0xf];
          auVar71[0xf] = 0;
          auVar66 = pshuflw(auVar71,auVar71,0x1b);
          auVar66 = pshufhw(auVar66,auVar66,0x1b);
          auVar4[0xd] = 0;
          auVar4._0_13_ = auVar44._0_13_;
          auVar4[0xe] = auVar44[7];
          auVar5[0xc] = auVar44[6];
          auVar5._0_12_ = auVar44._0_12_;
          auVar5._13_2_ = auVar4._13_2_;
          auVar7[0xb] = 0;
          auVar7._0_11_ = auVar44._0_11_;
          auVar7._12_3_ = auVar5._12_3_;
          auVar9[10] = auVar44[5];
          auVar9._0_10_ = auVar44._0_10_;
          auVar9._11_4_ = auVar7._11_4_;
          auVar11[9] = 0;
          auVar11._0_9_ = auVar44._0_9_;
          auVar11._10_5_ = auVar9._10_5_;
          auVar13[8] = auVar44[4];
          auVar13._0_8_ = auVar44._0_8_;
          auVar13._9_6_ = auVar11._9_6_;
          auVar19._7_8_ = 0;
          auVar19._0_7_ = auVar13._8_7_;
          auVar23._1_8_ = SUB158(auVar19 << 0x40,7);
          auVar23[0] = auVar44[3];
          auVar23._9_6_ = 0;
          auVar16[4] = auVar44[2];
          auVar16._0_4_ = auVar44._0_4_;
          auVar16._5_10_ = SUB1510(auVar23 << 0x30,5);
          auVar20._11_4_ = 0;
          auVar20._0_11_ = auVar16._4_11_;
          auVar18[2] = auVar44[1];
          auVar18._0_2_ = auVar44._0_2_;
          auVar18._3_12_ = SUB1512(auVar20 << 0x20,3);
          auVar86._0_2_ = auVar44._0_2_ & 0xff;
          auVar86._2_13_ = auVar18._2_13_;
          auVar86[0xf] = 0;
          auVar71 = pshuflw(auVar86,auVar86,0x1b);
          auVar71 = pshufhw(auVar71,auVar71,0x1b);
          sVar2 = auVar71._0_2_;
          sVar3 = auVar71._2_2_;
          uVar77 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar71[2] - (0xff < sVar3),
                            (0 < sVar2) * (sVar2 < 0x100) * auVar71[0] - (0xff < sVar2));
          sVar2 = auVar71._4_2_;
          sVar3 = auVar71._6_2_;
          uVar78 = CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar71[6] - (0xff < sVar3),
                            CONCAT12((0 < sVar2) * (sVar2 < 0x100) * auVar71[4] - (0xff < sVar2),
                                     uVar77));
          sVar2 = auVar71._8_2_;
          sVar3 = auVar71._10_2_;
          uVar79 = CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar71[10] - (0xff < sVar3),
                            CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar71[8] - (0xff < sVar2),
                                     uVar78));
          sVar2 = auVar71._12_2_;
          sVar3 = auVar71._14_2_;
          uVar80 = CONCAT17((0 < sVar3) * (sVar3 < 0x100) * auVar71[0xe] - (0xff < sVar3),
                            CONCAT16((0 < sVar2) * (sVar2 < 0x100) * auVar71[0xc] - (0xff < sVar2),
                                     uVar79));
          sVar2 = auVar66._0_2_;
          sVar3 = auVar66._2_2_;
          auVar81._0_10_ =
               CONCAT19((0 < sVar3) * (sVar3 < 0x100) * auVar66[2] - (0xff < sVar3),
                        CONCAT18((0 < sVar2) * (sVar2 < 0x100) * auVar66[0] - (0xff < sVar2),uVar80)
                       );
          sVar2 = auVar66._4_2_;
          auVar81[10] = (0 < sVar2) * (sVar2 < 0x100) * auVar66[4] - (0xff < sVar2);
          sVar2 = auVar66._6_2_;
          auVar81[0xb] = (0 < sVar2) * (sVar2 < 0x100) * auVar66[6] - (0xff < sVar2);
          sVar2 = auVar66._8_2_;
          auVar83[0xc] = (0 < sVar2) * (sVar2 < 0x100) * auVar66[8] - (0xff < sVar2);
          auVar83._0_12_ = auVar81;
          sVar2 = auVar66._10_2_;
          auVar83[0xd] = (0 < sVar2) * (sVar2 < 0x100) * auVar66[10] - (0xff < sVar2);
          sVar2 = auVar66._12_2_;
          auVar87[0xe] = (0 < sVar2) * (sVar2 < 0x100) * auVar66[0xc] - (0xff < sVar2);
          auVar87._0_14_ = auVar83;
          sVar2 = auVar66._14_2_;
          auVar87[0xf] = (0 < sVar2) * (sVar2 < 0x100) * auVar66[0xe] - (0xff < sVar2);
          auVar85._0_2_ = uVar77 >> 4;
          auVar85._2_2_ = (ushort)((uint)uVar78 >> 0x14);
          auVar85._4_2_ = (ushort)((uint6)uVar79 >> 0x24);
          auVar85._6_2_ = (ushort)((ulong)uVar80 >> 0x34);
          auVar85._8_2_ = (ushort)((unkuint10)auVar81._0_10_ >> 0x44);
          auVar85._10_2_ = auVar81._10_2_ >> 4;
          auVar85._12_2_ = auVar83._12_2_ >> 4;
          auVar85._14_2_ = auVar87._14_2_ >> 4;
          auVar66 = psllw(auVar87 & auVar26,4);
          auVar66 = auVar66 | auVar85 & auVar26;
          auVar72._0_2_ = auVar66._0_2_ >> 2;
          auVar72._2_2_ = auVar66._2_2_ >> 2;
          auVar72._4_2_ = auVar66._4_2_ >> 2;
          auVar72._6_2_ = auVar66._6_2_ >> 2;
          auVar72._8_2_ = auVar66._8_2_ >> 2;
          auVar72._10_2_ = auVar66._10_2_ >> 2;
          auVar72._12_2_ = auVar66._12_2_ >> 2;
          auVar72._14_2_ = auVar66._14_2_ >> 2;
          auVar66 = psllw(auVar66 & _DAT_0012ada0,2);
          auVar66 = auVar66 | auVar72 & _DAT_0012ada0;
          auVar73._0_2_ = auVar66._0_2_ >> 1;
          auVar73._2_2_ = auVar66._2_2_ >> 1;
          auVar73._4_2_ = auVar66._4_2_ >> 1;
          auVar73._6_2_ = auVar66._6_2_ >> 1;
          auVar73._8_2_ = auVar66._8_2_ >> 1;
          auVar73._10_2_ = auVar66._10_2_ >> 1;
          auVar73._12_2_ = auVar66._12_2_ >> 1;
          auVar73._14_2_ = auVar66._14_2_ >> 1;
          auVar66 = auVar66 & _DAT_0012adb0;
          auVar88[1] = auVar66[1] * '\x02';
          auVar88[0] = auVar66[0] * '\x02';
          auVar88[2] = auVar66[2] * '\x02';
          auVar88[3] = auVar66[3] * '\x02';
          auVar88[4] = auVar66[4] * '\x02';
          auVar88[5] = auVar66[5] * '\x02';
          auVar88[6] = auVar66[6] * '\x02';
          auVar88[7] = auVar66[7] * '\x02';
          auVar88[8] = auVar66[8] * '\x02';
          auVar88[9] = auVar66[9] * '\x02';
          auVar88[10] = auVar66[10] * '\x02';
          auVar88[0xb] = auVar66[0xb] * '\x02';
          auVar88[0xc] = auVar66[0xc] * '\x02';
          auVar88[0xd] = auVar66[0xd] * '\x02';
          auVar88[0xe] = auVar66[0xe] * '\x02';
          auVar88[0xf] = auVar66[0xf] * '\x02';
          auVar88 = auVar88 | auVar73 & _DAT_0012adb0;
          if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35) = (short)((auVar88._0_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar59 = auVar75 & auVar76 | auVar59;
          auVar76 = packssdw(auVar59,auVar59);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar76 = packssdw(auVar76 ^ auVar67,auVar76 ^ auVar67);
          if ((auVar76._0_4_ >> 0x10 & 1) != 0) {
            *(short *)((long)puVar30 + lVar35 + 2) =
                 (short)((auVar88._4_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar76 = auVar49 ^ auVar25;
          iVar64 = -(uint)(iVar36 < auVar76._0_4_);
          auVar68._4_4_ = -(uint)(iVar40 < auVar76._4_4_);
          iVar65 = -(uint)(iVar70 < auVar76._8_4_);
          auVar68._12_4_ = -(uint)(iVar41 < auVar76._12_4_);
          auVar51._4_4_ = iVar64;
          auVar51._0_4_ = iVar64;
          auVar51._8_4_ = iVar65;
          auVar51._12_4_ = iVar65;
          auVar60._4_4_ = -(uint)(auVar76._4_4_ == iVar40);
          auVar60._12_4_ = -(uint)(auVar76._12_4_ == iVar41);
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar76 = auVar60 & auVar51 | auVar68;
          auVar76 = packssdw(auVar76,auVar76);
          auVar74 = packssdw(auVar76 ^ auVar67,auVar76 ^ auVar67);
          if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            auVar74._0_8_ = auVar88._8_8_;
            auVar74._8_4_ = auVar88._8_4_;
            auVar74._12_4_ = auVar88._12_4_;
            *(short *)((long)puVar30 + lVar35 + 4) =
                 (short)((auVar88._8_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar76 = pshufhw(auVar51,auVar51,0x84);
          auVar66 = pshufhw(auVar60,auVar60,0x84);
          auVar59 = pshufhw(auVar76,auVar68,0x84);
          auVar76 = (auVar59 | auVar66 & auVar76) ^ auVar67;
          auVar76 = packssdw(auVar76,auVar76);
          if ((auVar76 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 6) =
                 (short)((auVar88._12_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar52[1] = 0;
          auVar52[0] = auVar43[8];
          auVar52[2] = auVar43[9];
          auVar52[3] = 0;
          auVar52[4] = auVar43[10];
          auVar52[5] = 0;
          auVar52[6] = auVar43[0xb];
          auVar52[7] = 0;
          auVar52[8] = auVar43[0xc];
          auVar52[9] = 0;
          auVar52[10] = auVar43[0xd];
          auVar52[0xb] = 0;
          auVar52[0xc] = auVar43[0xe];
          auVar52[0xd] = 0;
          auVar52[0xe] = auVar43[0xf];
          auVar52[0xf] = 0;
          auVar76 = pshuflw(auVar52,auVar52,0x1b);
          auVar76 = pshufhw(auVar76,auVar76,0x1b);
          auVar6[0xd] = 0;
          auVar6._0_13_ = auVar43._0_13_;
          auVar6[0xe] = auVar43[7];
          auVar8[0xc] = auVar43[6];
          auVar8._0_12_ = auVar43._0_12_;
          auVar8._13_2_ = auVar6._13_2_;
          auVar10[0xb] = 0;
          auVar10._0_11_ = auVar43._0_11_;
          auVar10._12_3_ = auVar8._12_3_;
          auVar12[10] = auVar43[5];
          auVar12._0_10_ = auVar43._0_10_;
          auVar12._11_4_ = auVar10._11_4_;
          auVar14[9] = 0;
          auVar14._0_9_ = auVar43._0_9_;
          auVar14._10_5_ = auVar12._10_5_;
          auVar15[8] = auVar43[4];
          auVar15._0_8_ = auVar43._0_8_;
          auVar15._9_6_ = auVar14._9_6_;
          auVar21._7_8_ = 0;
          auVar21._0_7_ = auVar15._8_7_;
          auVar24._1_8_ = SUB158(auVar21 << 0x40,7);
          auVar24[0] = auVar43[3];
          auVar24._9_6_ = 0;
          auVar17[4] = auVar43[2];
          auVar17._0_4_ = auVar43._0_4_;
          auVar17._5_10_ = SUB1510(auVar24 << 0x30,5);
          auVar22._11_4_ = 0;
          auVar22._0_11_ = auVar17._4_11_;
          auVar61._3_12_ = SUB1512(auVar22 << 0x20,3);
          auVar61[2] = auVar43[1];
          auVar61[0] = auVar43[0];
          auVar61[1] = 0;
          auVar61[0xf] = 0;
          auVar59 = pshuflw(auVar61,auVar61,0x1b);
          auVar59 = pshufhw(auVar88,auVar59,0x1b);
          sVar2 = auVar59._0_2_;
          sVar3 = auVar59._2_2_;
          uVar77 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar59[2] - (0xff < sVar3),
                            (0 < sVar2) * (sVar2 < 0x100) * auVar59[0] - (0xff < sVar2));
          sVar2 = auVar59._4_2_;
          sVar3 = auVar59._6_2_;
          uVar78 = CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar59[6] - (0xff < sVar3),
                            CONCAT12((0 < sVar2) * (sVar2 < 0x100) * auVar59[4] - (0xff < sVar2),
                                     uVar77));
          sVar2 = auVar59._8_2_;
          sVar3 = auVar59._10_2_;
          uVar79 = CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar59[10] - (0xff < sVar3),
                            CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar59[8] - (0xff < sVar2),
                                     uVar78));
          sVar2 = auVar59._12_2_;
          sVar3 = auVar59._14_2_;
          uVar80 = CONCAT17((0 < sVar3) * (sVar3 < 0x100) * auVar59[0xe] - (0xff < sVar3),
                            CONCAT16((0 < sVar2) * (sVar2 < 0x100) * auVar59[0xc] - (0xff < sVar2),
                                     uVar79));
          sVar2 = auVar76._0_2_;
          sVar3 = auVar76._2_2_;
          auVar82._0_10_ =
               CONCAT19((0 < sVar3) * (sVar3 < 0x100) * auVar76[2] - (0xff < sVar3),
                        CONCAT18((0 < sVar2) * (sVar2 < 0x100) * auVar76[0] - (0xff < sVar2),uVar80)
                       );
          sVar2 = auVar76._4_2_;
          auVar82[10] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[4] - (0xff < sVar2);
          sVar2 = auVar76._6_2_;
          auVar82[0xb] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[6] - (0xff < sVar2);
          sVar2 = auVar76._8_2_;
          auVar84[0xc] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[8] - (0xff < sVar2);
          auVar84._0_12_ = auVar82;
          sVar2 = auVar76._10_2_;
          auVar84[0xd] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[10] - (0xff < sVar2);
          sVar2 = auVar76._12_2_;
          auVar89[0xe] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[0xc] - (0xff < sVar2);
          auVar89._0_14_ = auVar84;
          sVar2 = auVar76._14_2_;
          auVar89[0xf] = (0 < sVar2) * (sVar2 < 0x100) * auVar76[0xe] - (0xff < sVar2);
          auVar53._0_2_ = uVar77 >> 4;
          auVar53._2_2_ = (ushort)((uint)uVar78 >> 0x14);
          auVar53._4_2_ = (ushort)((uint6)uVar79 >> 0x24);
          auVar53._6_2_ = (ushort)((ulong)uVar80 >> 0x34);
          auVar53._8_2_ = (ushort)((unkuint10)auVar82._0_10_ >> 0x44);
          auVar53._10_2_ = auVar82._10_2_ >> 4;
          auVar53._12_2_ = auVar84._12_2_ >> 4;
          auVar53._14_2_ = auVar89._14_2_ >> 4;
          auVar76 = psllw(auVar89 & auVar26,4);
          auVar76 = auVar76 | auVar53 & auVar26;
          auVar54._0_2_ = auVar76._0_2_ >> 2;
          auVar54._2_2_ = auVar76._2_2_ >> 2;
          auVar54._4_2_ = auVar76._4_2_ >> 2;
          auVar54._6_2_ = auVar76._6_2_ >> 2;
          auVar54._8_2_ = auVar76._8_2_ >> 2;
          auVar54._10_2_ = auVar76._10_2_ >> 2;
          auVar54._12_2_ = auVar76._12_2_ >> 2;
          auVar54._14_2_ = auVar76._14_2_ >> 2;
          auVar76 = psllw(auVar76 & _DAT_0012ada0,2);
          auVar76 = auVar76 | auVar54 & _DAT_0012ada0;
          auVar55._0_2_ = auVar76._0_2_ >> 1;
          auVar55._2_2_ = auVar76._2_2_ >> 1;
          auVar55._4_2_ = auVar76._4_2_ >> 1;
          auVar55._6_2_ = auVar76._6_2_ >> 1;
          auVar55._8_2_ = auVar76._8_2_ >> 1;
          auVar55._10_2_ = auVar76._10_2_ >> 1;
          auVar55._12_2_ = auVar76._12_2_ >> 1;
          auVar55._14_2_ = auVar76._14_2_ >> 1;
          auVar76 = auVar76 & _DAT_0012adb0;
          in_XMM15[1] = auVar76[1] * '\x02';
          in_XMM15[0] = auVar76[0] * '\x02';
          in_XMM15[2] = auVar76[2] * '\x02';
          in_XMM15[3] = auVar76[3] * '\x02';
          in_XMM15[4] = auVar76[4] * '\x02';
          in_XMM15[5] = auVar76[5] * '\x02';
          in_XMM15[6] = auVar76[6] * '\x02';
          in_XMM15[7] = auVar76[7] * '\x02';
          in_XMM15[8] = auVar76[8] * '\x02';
          in_XMM15[9] = auVar76[9] * '\x02';
          in_XMM15[10] = auVar76[10] * '\x02';
          in_XMM15[0xb] = auVar76[0xb] * '\x02';
          in_XMM15[0xc] = auVar76[0xc] * '\x02';
          in_XMM15[0xd] = auVar76[0xd] * '\x02';
          in_XMM15[0xe] = auVar76[0xe] * '\x02';
          in_XMM15[0xf] = auVar76[0xf] * '\x02';
          in_XMM15 = in_XMM15 | auVar55 & _DAT_0012adb0;
          auVar76 = auVar48 ^ auVar25;
          iVar64 = -(uint)(iVar36 < auVar76._0_4_);
          auVar57._4_4_ = -(uint)(iVar40 < auVar76._4_4_);
          iVar65 = -(uint)(iVar70 < auVar76._8_4_);
          auVar57._12_4_ = -(uint)(iVar41 < auVar76._12_4_);
          auVar62._4_4_ = iVar64;
          auVar62._0_4_ = iVar64;
          auVar62._8_4_ = iVar65;
          auVar62._12_4_ = iVar65;
          auVar59 = pshuflw(auVar74,auVar62,0xe8);
          auVar56._4_4_ = -(uint)(auVar76._4_4_ == iVar40);
          auVar56._12_4_ = -(uint)(auVar76._12_4_ == iVar41);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar66 = pshuflw(auVar25,auVar56,0xe8);
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar76 = pshuflw(auVar59,auVar57,0xe8);
          auVar76 = (auVar76 | auVar66 & auVar59) ^ auVar67;
          auVar76 = packssdw(auVar76,auVar76);
          if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 8) =
                 (short)((in_XMM15._0_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar57 = auVar56 & auVar62 | auVar57;
          auVar76 = packssdw(auVar57,auVar57);
          auVar76 = packssdw(auVar76 ^ auVar67,auVar76 ^ auVar67);
          if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 10) =
                 (short)((in_XMM15._4_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar76 = auVar46 ^ auVar25;
          iVar36 = -(uint)(iVar36 < auVar76._0_4_);
          auVar69._4_4_ = -(uint)(iVar40 < auVar76._4_4_);
          iVar70 = -(uint)(iVar70 < auVar76._8_4_);
          auVar69._12_4_ = -(uint)(iVar41 < auVar76._12_4_);
          auVar58._4_4_ = iVar36;
          auVar58._0_4_ = iVar36;
          auVar58._8_4_ = iVar70;
          auVar58._12_4_ = iVar70;
          auVar63._4_4_ = -(uint)(auVar76._4_4_ == iVar40);
          auVar63._12_4_ = -(uint)(auVar76._12_4_ == iVar41);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar76 = auVar63 & auVar58 | auVar69;
          auVar76 = packssdw(auVar76,auVar76);
          in_XMM11 = packssdw(auVar76 ^ auVar67,auVar76 ^ auVar67);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            in_XMM11._0_8_ = in_XMM15._8_8_;
            in_XMM11._8_4_ = in_XMM15._8_4_;
            in_XMM11._12_4_ = in_XMM15._12_4_;
            *(short *)((long)puVar30 + lVar35 + 0xc) =
                 (short)((in_XMM15._8_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar76 = pshufhw(auVar58,auVar58,0x84);
          auVar66 = pshufhw(auVar63,auVar63,0x84);
          auVar59 = pshufhw(auVar76,auVar69,0x84);
          auVar76 = (auVar59 | auVar66 & auVar76) ^ auVar67;
          auVar76 = packssdw(auVar76,auVar76);
          if ((auVar76 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 0xe) =
                 (short)((in_XMM15._12_4_ >> (bVar31 & 0x1f)) << 2);
          }
          lVar47 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 8;
          auVar50._8_8_ = lVar47 + 8;
          lVar47 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + 8;
          auVar49._8_8_ = lVar47 + 8;
          lVar47 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 8;
          auVar48._8_8_ = lVar47 + 8;
          lVar47 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 8;
          auVar46._8_8_ = lVar47 + 8;
          auVar45._0_4_ = auVar44._0_4_ + 8;
          auVar45._4_4_ = auVar44._4_4_ + 8;
          auVar45._8_4_ = auVar44._8_4_ + 8;
          auVar45._12_4_ = auVar44._12_4_ + 8;
          auVar44._0_4_ = auVar43._0_4_ + 8;
          auVar44._4_4_ = auVar43._4_4_ + 8;
          auVar44._8_4_ = auVar43._8_4_ + 8;
          auVar44._12_4_ = auVar43._12_4_ + 8;
          lVar35 = lVar35 + 0x10;
          auVar43 = auVar44;
          auVar44 = auVar45;
        } while ((ulong)(uVar27 + 7 >> 3) << 4 != lVar35);
        return 1;
      }
    }
  }
  f->error = VORBIS_outofmem;
  return 0;
}

Assistant:

static int init_blocksize(vorb *f, int b, int n)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3;
   f->A[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->B[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->C[b] = (float *) setup_malloc(f, sizeof(float) * n4);
   if (!f->A[b] || !f->B[b] || !f->C[b]) return error(f, VORBIS_outofmem);
   compute_twiddle_factors(n, f->A[b], f->B[b], f->C[b]);
   f->window[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   if (!f->window[b]) return error(f, VORBIS_outofmem);
   compute_window(n, f->window[b]);
   f->bit_reverse[b] = (uint16 *) setup_malloc(f, sizeof(uint16) * n8);
   if (!f->bit_reverse[b]) return error(f, VORBIS_outofmem);
   compute_bitreverse(n, f->bit_reverse[b]);
   return TRUE;
}